

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<TPZEqnArray<float>,_10>::~TPZManVector(TPZManVector<TPZEqnArray<float>,_10> *this)

{
  undefined8 *in_RDI;
  TPZVec<TPZEqnArray<float>_> *unaff_retaddr;
  TPZEqnArray<float> *this_00;
  TPZEqnArray<float> *local_18;
  
  *in_RDI = &PTR__TPZManVector_025502e8;
  if ((undefined8 *)in_RDI[1] == in_RDI + 4) {
    in_RDI[1] = 0;
  }
  in_RDI[3] = 0;
  this_00 = (TPZEqnArray<float> *)(in_RDI + 4);
  local_18 = (TPZEqnArray<float> *)(in_RDI + 0x2bb0);
  do {
    local_18 = local_18 + -1;
    TPZEqnArray<float>::~TPZEqnArray(this_00);
  } while (local_18 != this_00);
  TPZVec<TPZEqnArray<float>_>::~TPZVec(unaff_retaddr);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}